

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_zip_zip64.c
# Opt level: O3

void verify_file0_stream(archive *a,int size_known)

{
  int iVar1;
  mode_t mVar2;
  wchar_t value;
  char *v2;
  la_int64_t v2_00;
  la_ssize_t v2_01;
  archive_entry *ae;
  char data [16];
  archive_entry *local_40;
  undefined1 local_38 [16];
  
  iVar1 = archive_read_next_header(a,&local_40);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_zip64.c"
                      ,L':',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
  v2 = archive_entry_pathname(local_40);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_zip64.c"
             ,L';',"-","\"-\"",v2,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  mVar2 = archive_entry_mode(local_40);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_zip64.c"
                      ,L'<',0x81b4,"AE_IFREG | 0664",(ulong)mVar2,"archive_entry_mode(ae)",
                      (void *)0x0);
  value = archive_entry_size_is_set(local_40);
  if (size_known == 0) {
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_zip64.c"
                     ,L'D',(uint)(value == L'\0'),"!archive_entry_size_is_set(ae)",(void *)0x0);
  }
  else {
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_zip64.c"
                     ,L'@',value,"archive_entry_size_is_set(ae)",(void *)0x0);
    v2_00 = archive_entry_size(local_40);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_zip64.c"
                        ,L'A',6,"6",v2_00,"archive_entry_size(ae)",(void *)0x0);
  }
  v2_01 = archive_read_data(a,local_38,0x10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_zip64.c"
                      ,L'I',6,"6",v2_01,"archive_read_data(a, data, 16)",a);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_zip64.c"
                      ,L'J',local_38,"data","file0\n","\"file0\\x0a\"",6,"6",(void *)0x0);
  iVar1 = archive_read_next_header(a,&local_40);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_zip64.c"
                      ,L'M',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",a);
  iVar1 = archive_read_close(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_zip64.c"
                      ,L'N',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",a);
  iVar1 = archive_read_free(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_zip_zip64.c"
                      ,L'O',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",a);
  return;
}

Assistant:

static void
verify_file0_stream(struct archive *a, int size_known)
{
	struct archive_entry *ae;

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("-", archive_entry_pathname(ae));
	assertEqualInt(AE_IFREG | 0664, archive_entry_mode(ae));
	if (size_known) {
		// zip64b has the uncompressed size at the beginning,
		// plus CRC and compressed size using length-at-end.
		assert(archive_entry_size_is_set(ae));
		assertEqualInt(6, archive_entry_size(ae));
	} else {
		// zip64a does not have a size at the beginning at all.
		assert(!archive_entry_size_is_set(ae));
	}
#ifdef HAVE_ZLIB_H
	{
		char data[16];
		assertEqualIntA(a, 6, archive_read_data(a, data, 16));
		assertEqualMem(data, "file0\x0a", 6);
	}
#endif
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_free(a));
}